

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O1

bool duckdb::Date::TryConvertDateSpecial(char *buf,idx_t len,idx_t *pos,char *special)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  byte *pbVar5;
  byte *pbVar6;
  char s;
  byte bVar7;
  
  uVar3 = *pos;
  uVar4 = uVar3;
  pbVar5 = (byte *)special;
  if (uVar3 <= len && len - uVar3 != 0) {
    pbVar6 = (byte *)(special + (len - uVar3));
    do {
      uVar4 = uVar3;
      pbVar5 = (byte *)special;
      if (*special == 0) break;
      bVar1 = buf[uVar3];
      bVar7 = bVar1 | 0x20;
      if (0x19 < (byte)(bVar1 + 0xbf)) {
        bVar7 = bVar1;
      }
      if (bVar7 != *special) goto LAB_002d5551;
      special = (char *)((byte *)special + 1);
      uVar3 = uVar3 + 1;
      uVar4 = len;
      pbVar5 = pbVar6;
    } while (len != uVar3);
  }
  if (*pbVar5 == 0) {
    *pos = uVar4;
    bVar2 = true;
  }
  else {
LAB_002d5551:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Date::TryConvertDateSpecial(const char *buf, idx_t len, idx_t &pos, const char *special) {
	auto p = pos;
	for (; p < len && *special; ++p) {
		const auto s = *special++;
		if (!s || StringUtil::CharacterToLower(buf[p]) != s) {
			return false;
		}
	}
	if (*special) {
		return false;
	}
	pos = p;
	return true;
}